

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::EytzingerLayoutSorter::Sort
          (EytzingerLayoutSorter *this,size_t output_index)

{
  ulong uVar1;
  ulong uVar2;
  
  while( true ) {
    if ((this->input).len_ <= output_index) {
      return;
    }
    Sort(this,output_index * 2 + 1);
    uVar1 = (this->input).len_;
    uVar2 = this->i;
    this->i = uVar2 + 1;
    if (uVar1 <= uVar2) break;
    if ((this->output).len_ <= output_index) goto LAB_0041c6be;
    (this->output).ptr_[output_index] = (this->input).ptr_[uVar2];
    output_index = output_index * 2 + 2;
  }
  Sort();
LAB_0041c6be:
  Sort();
}

Assistant:

void Sort(size_t output_index = 0) {
    if (output_index < input.size()) {
      Sort(2 * output_index + 1);
      output[output_index] = input[i++];
      Sort(2 * output_index + 2);
    }
  }